

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printResultType(AssertionPrinter *this)

{
  ostream *poVar1;
  Colour colourGuard;
  
  if ((this->passOrFail)._M_string_length != 0) {
    Colour::use(this->colour);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->stream,(this->passOrFail)._M_dataplus._M_p,
                        (this->passOrFail)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":\n",2);
    Colour::use(None);
  }
  return;
}

Assistant:

Contains( Contains const& other ) : m_data( other.m_data ){}